

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

FieldDescriptor * __thiscall
google::protobuf::Descriptor::FindFieldByName(Descriptor *this,string_view name)

{
  ctrl_t *pcVar1;
  anon_union_8_1_a8a14541_for_iterator_2 this_00;
  long lVar2;
  undefined1 auVar3 [16];
  size_t *psVar4;
  bool bVar5;
  ushort uVar6;
  Symbol *key_6;
  uint64_t uVar7;
  slot_type *psVar8;
  size_t sVar9;
  SymbolByParentEq *pSVar10;
  reference pSVar11;
  ParentNameFieldQuery *query;
  ParentNameFieldQuery *extraout_RDX;
  ParentNameFieldQuery *extraout_RDX_00;
  ParentNameFieldQuery *extraout_RDX_01;
  ParentNameFieldQuery *query_00;
  ParentNameFieldQuery *query_01;
  ParentNameFieldQuery *extraout_RDX_02;
  ParentNameFieldQuery *extraout_RDX_03;
  ParentNameFieldQuery *pPVar12;
  undefined1 *puVar13;
  ulong uVar14;
  anon_union_8_1_a8a14541_for_iterator_2 aVar15;
  anon_union_8_1_a8a14541_for_iterator_2 *paVar16;
  ulong uVar17;
  uintptr_t v;
  undefined1 uVar18;
  value_type *element_1;
  ulong uVar19;
  uint uVar20;
  uchar *bytes;
  anon_union_8_1_a8a14541_for_iterator_2 aVar21;
  uint uVar22;
  uint64_t v_3;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  iterator iVar25;
  __m128i match;
  const_iterator it;
  ulong local_b8;
  anon_union_8_1_a8a14541_for_iterator_2 local_a0;
  anon_union_8_1_a8a14541_for_iterator_2 local_98;
  anon_union_8_1_a8a14541_for_iterator_2 local_90;
  ulong local_88;
  ctrl_t *local_80;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  ctrl_t local_68;
  ctrl_t cStack_67;
  ctrl_t cStack_66;
  ctrl_t cStack_65;
  ctrl_t cStack_64;
  ctrl_t cStack_63;
  ctrl_t cStack_62;
  ctrl_t cStack_61;
  ctrl_t cStack_60;
  ctrl_t cStack_5f;
  ctrl_t cStack_5e;
  ctrl_t cStack_5d;
  ctrl_t cStack_5c;
  ctrl_t cStack_5b;
  ctrl_t cStack_5a;
  ctrl_t cStack_59;
  const_iterator local_50;
  anon_union_8_1_a8a14541_for_iterator_2 local_40;
  anon_union_8_1_a8a14541_for_iterator_2 local_38;
  
  aVar21 = (anon_union_8_1_a8a14541_for_iterator_2)name._M_str;
  aVar15 = (anon_union_8_1_a8a14541_for_iterator_2)name._M_len;
  this_00 = (anon_union_8_1_a8a14541_for_iterator_2)this->file_->tables_;
  local_a0 = (anon_union_8_1_a8a14541_for_iterator_2)this;
  local_98 = aVar15;
  local_90 = aVar21;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
              *)this_00.slot_);
  puVar13 = (undefined1 *)this_00;
  if (1 < *(ulong *)(this_00.slot_ + 1)) {
    puVar13 = (undefined1 *)0xdcb22ca68cb134ed;
    uVar17 = ((ulong)this ^ 0x46ead8) * -0x234dd359734ecb13;
    uVar17 = ((uVar17 >> 0x38 | (uVar17 & 0xff000000000000) >> 0x28 |
               (uVar17 & 0xff0000000000) >> 0x18 | (uVar17 & 0xff00000000) >> 8 |
               (uVar17 & 0xff000000) << 8 | (uVar17 & 0xff0000) << 0x18 | (uVar17 & 0xff00) << 0x28
              | uVar17 << 0x38) ^ (ulong)this) * -0x234dd359734ecb13;
    uVar7 = absl::lts_20250127::hash_internal::MixingHashState::CombineContiguousImpl
                      (uVar17 >> 0x38 | (uVar17 & 0xff000000000000) >> 0x28 |
                       (uVar17 & 0xff0000000000) >> 0x18 | (uVar17 & 0xff00000000) >> 8 |
                       (uVar17 & 0xff000000) << 8 | (uVar17 & 0xff0000) << 0x18 |
                       (uVar17 & 0xff00) << 0x28 | uVar17 << 0x38,aVar21.slot_,aVar15.slot_);
    uVar17 = (uVar7 ^ (ulong)aVar15.slot_) * -0x234dd359734ecb13;
    uVar19 = uVar17 >> 0x38 | (uVar17 & 0xff000000000000) >> 0x28 |
             (uVar17 & 0xff0000000000) >> 0x18 | (uVar17 & 0xff00000000) >> 8 |
             (uVar17 & 0xff000000) << 8 | (uVar17 & 0xff0000) << 0x18 | (uVar17 & 0xff00) << 0x28 |
             uVar17 << 0x38;
    uVar17 = (((CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                *)&(this_00.slot_)->ptr_)->
             super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
             ).super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value
             .capacity_;
    if (uVar17 == 1) {
      pSVar10 = (SymbolByParentEq *)
                absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                            *)this_00.slot_);
      paVar16 = &local_a0;
      bVar5 = anon_unknown_24::SymbolByParentEq::operator()(pSVar10,(Symbol *)paVar16,query_01);
      if ((bVar5) &&
         (sVar9 = (anonymous_namespace)::SymbolByParentHash::operator()
                            ((SymbolByParentHash *)pSVar10,(Symbol *)paVar16), uVar19 != sVar9)) {
LAB_001527b0:
        __assert_fail("(!is_key_equal || is_hash_equal) && \"eq(k1, k2) must imply that hash(k1) == hash(k2). \" \"hash/eq functors are inconsistent.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xfbf,
                      "auto absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::AssertHashEqConsistent(const google::protobuf::(anonymous namespace)::ParentNameFieldQuery &)::(anonymous class)::operator()(const ctrl_t *, slot_type *) const [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>]"
                     );
      }
    }
    else {
      if (uVar17 == 0) goto LAB_001528dc;
      if (uVar17 < 0x11) {
        psVar8 = absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                 ::slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                               *)this_00.slot_);
        uVar17 = (((CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                    *)&(this_00.slot_)->ptr_)->
                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 ).super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                 value.capacity_;
        puVar13 = (undefined1 *)
                  ((anon_union_8_1_a8a14541_for_iterator_2 *)(this_00.slot_ + 2))->slot_;
        aVar21 = this_00;
        if (uVar17 < 0xf) {
          if (8 < uVar17) {
            __assert_fail("(cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\") && \"Try enabling sanitizers.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x78b,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = google::protobuf::Symbol, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                         );
          }
          puVar13 = (undefined1 *)
                    (*(ulong *)((long)&(((SymbolsByParentSet *)&((slot_type *)puVar13)->ptr_)->
                                       super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                       ).settings_.
                                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                       .
                                       super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                       .value.capacity_ + uVar17) & 0x8080808080808080);
          if ((FileDescriptorTables *)puVar13 != (FileDescriptorTables *)0x8080808080808080) {
            uVar17 = (ulong)puVar13 ^ 0x8080808080808080;
            pPVar12 = extraout_RDX;
            do {
              lVar2 = 0;
              if (uVar17 != 0) {
                for (; (uVar17 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
                }
              }
              pSVar10 = (SymbolByParentEq *)
                        ((long)&psVar8[-1].ptr_ + (ulong)((uint)lVar2 & 0xfffffff8));
              paVar16 = &local_a0;
              bVar5 = anon_unknown_24::SymbolByParentEq::operator()
                                (pSVar10,(Symbol *)&local_a0,pPVar12);
              pPVar12 = extraout_RDX_00;
              if ((bVar5) &&
                 (sVar9 = (anonymous_namespace)::SymbolByParentHash::operator()
                                    ((SymbolByParentHash *)pSVar10,(Symbol *)paVar16),
                 pPVar12 = extraout_RDX_01, uVar19 != sVar9)) goto LAB_001527b0;
              uVar17 = uVar17 & uVar17 - 1;
            } while (uVar17 != 0);
            puVar13 = (undefined1 *)0x0;
          }
        }
        else {
          uVar17 = *(ulong *)(this_00.slot_ + 1) >> 1;
          if (1 < *(ulong *)(this_00.slot_ + 1)) {
            pPVar12 = extraout_RDX;
            uVar14 = uVar17;
            while( true ) {
              auVar23 = *(undefined1 (*) [16])puVar13;
              uVar6 = (ushort)(SUB161(auVar23 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar23[0xf] >> 7) << 0xf;
              aVar21._2_6_ = 0;
              aVar21._0_2_ = uVar6;
              if (uVar6 != 0xffff) {
                aVar21._0_4_ = ~(uint)uVar6;
                aVar21._4_4_ = 0;
                do {
                  uVar22 = 0;
                  uVar20 = aVar21._0_4_;
                  if (uVar20 != 0) {
                    for (; (uVar20 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                    }
                  }
                  if ((char)((HeapOrSoo *)&((slot_type *)puVar13)->ptr_)->soo_data[uVar22] < '\0')
                  goto LAB_001528bd;
                  paVar16 = &local_a0;
                  bVar5 = anon_unknown_24::SymbolByParentEq::operator()
                                    ((SymbolByParentEq *)(psVar8 + uVar22),(Symbol *)&local_a0,
                                     pPVar12);
                  pPVar12 = extraout_RDX_02;
                  if ((bVar5) &&
                     (sVar9 = (anonymous_namespace)::SymbolByParentHash::operator()
                                        ((SymbolByParentHash *)(psVar8 + uVar22),(Symbol *)paVar16),
                     pPVar12 = extraout_RDX_03, uVar19 != sVar9)) goto LAB_001527b0;
                  uVar14 = uVar14 - 1;
                  uVar6 = (ushort)(uVar20 - 1) & aVar21._0_2_;
                  aVar21._2_2_ = (short)(uVar20 - 1 >> 0x10);
                  aVar21._0_2_ = uVar6;
                  aVar21._4_4_ = 0;
                } while (uVar6 != 0);
              }
              if (uVar14 == 0) break;
              psVar8 = psVar8 + 0x10;
              psVar4 = (size_t *)((long)puVar13 + 8);
              puVar13 = (undefined1 *)((long)puVar13 + 0x10);
              if (*(undefined1 *)((long)psVar4 + 7) == -1) {
                __assert_fail("((remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                              ,0x7a5,
                              "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = google::protobuf::Symbol, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                             );
              }
            }
          }
          if (uVar17 < *(ulong *)(this_00.slot_ + 1) >> 1) {
            __assert_fail("(original_size_for_assert >= c.size() && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x7aa,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = google::protobuf::Symbol, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                         );
          }
        }
      }
    }
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
              *)this_00.slot_);
  sVar9 = (((CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
             *)&(this_00.slot_)->ptr_)->
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          ).super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          capacity_;
  if (sVar9 == 1) {
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
    ::AssertNotDebugCapacity
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                *)this_00.slot_);
    if (1 < *(ulong *)(this_00.slot_ + 1)) {
      pSVar10 = (SymbolByParentEq *)
                absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                            *)this_00.slot_);
      bVar5 = anon_unknown_24::SymbolByParentEq::operator()(pSVar10,(Symbol *)&local_a0,query_00);
      if (bVar5) {
        aVar21.slot_ = absl::lts_20250127::container_internal::
                       raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                       ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                   *)this_00.slot_);
        puVar13 = absl::lts_20250127::container_internal::kSooControl;
        goto LAB_001526f7;
      }
    }
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
    ::AssertNotDebugCapacity
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                *)this_00.slot_);
    puVar13 = (undefined1 *)0x0;
  }
  else {
    if (sVar9 == 0) {
LAB_001528dc:
      __assert_fail("cap >= kDefaultCapacity",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xb75,
                    "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>]"
                   );
    }
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
    ::prefetch_heap_block
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                *)this_00.slot_);
    aVar15 = local_98;
    aVar21.slot_ = (slot_type *)0xdcb22ca68cb134ed;
    uVar17 = ((ulong)local_a0.slot_ ^ 0x46ead8) * -0x234dd359734ecb13;
    uVar17 = ((uVar17 >> 0x38 | (uVar17 & 0xff000000000000) >> 0x28 |
               (uVar17 & 0xff0000000000) >> 0x18 | (uVar17 & 0xff00000000) >> 8 |
               (uVar17 & 0xff000000) << 8 | (uVar17 & 0xff0000) << 0x18 | (uVar17 & 0xff00) << 0x28
              | uVar17 << 0x38) ^ (ulong)local_a0.slot_) * -0x234dd359734ecb13;
    uVar7 = absl::lts_20250127::hash_internal::MixingHashState::CombineContiguousImpl
                      (uVar17 >> 0x38 | (uVar17 & 0xff000000000000) >> 0x28 |
                       (uVar17 & 0xff0000000000) >> 0x18 | (uVar17 & 0xff00000000) >> 8 |
                       (uVar17 & 0xff000000) << 8 | (uVar17 & 0xff0000) << 0x18 |
                       (uVar17 & 0xff00) << 0x28 | uVar17 << 0x38,local_90.slot_,local_98.slot_);
    uVar17 = *(ulong *)this_00;
    if (uVar17 == 1) {
      __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xe2a,
                    "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>, K = google::protobuf::(anonymous namespace)::ParentNameFieldQuery]"
                   );
    }
    if (uVar17 == 0) goto LAB_001528dc;
    if ((uVar17 + 1 & uVar17) != 0) {
      __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0x14c,
                    "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]"
                   );
    }
    uVar19 = (uVar7 ^ (ulong)aVar15.slot_) * -0x234dd359734ecb13;
    local_b8 = ((uVar19 >> 0x38 | (uVar19 & 0xff000000000000) >> 0x28 |
                 (uVar19 & 0xff0000000000) >> 0x18 | (uVar19 & 0xff00000000) >> 8 |
                 (uVar19 & 0xff000000) << 8 | (uVar19 & 0xff0000) << 0x18 |
                 (uVar19 & 0xff00) << 0x28 | uVar19 << 0x38) >> 7 ^
               (ulong)(((HeapOrSoo *)(this_00.slot_ + 2))->heap).control >> 0xc) & uVar17;
    local_80 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
               ::control((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                          *)this_00.slot_);
    uVar18 = (undefined1)(uVar19 >> 0x38);
    auVar23 = ZEXT216(CONCAT11(uVar18,uVar18) & 0x7f7f);
    auVar23 = pshuflw(auVar23,auVar23,0);
    local_78 = auVar23._0_4_;
    uVar19 = 0;
    uStack_74 = local_78;
    uStack_70 = local_78;
    uStack_6c = local_78;
    do {
      pcVar1 = local_80 + local_b8;
      local_68 = *pcVar1;
      cStack_67 = pcVar1[1];
      cStack_66 = pcVar1[2];
      cStack_65 = pcVar1[3];
      cStack_64 = pcVar1[4];
      cStack_63 = pcVar1[5];
      cStack_62 = pcVar1[6];
      cStack_61 = pcVar1[7];
      cStack_60 = pcVar1[8];
      cStack_5f = pcVar1[9];
      cStack_5e = pcVar1[10];
      cStack_5d = pcVar1[0xb];
      cStack_5c = pcVar1[0xc];
      cStack_5b = pcVar1[0xd];
      cStack_5a = pcVar1[0xe];
      cStack_59 = pcVar1[0xf];
      auVar23[0] = -((ctrl_t)local_78 == local_68);
      auVar23[1] = -(local_78._1_1_ == cStack_67);
      auVar23[2] = -(local_78._2_1_ == cStack_66);
      auVar23[3] = -(local_78._3_1_ == cStack_65);
      auVar23[4] = -((ctrl_t)uStack_74 == cStack_64);
      auVar23[5] = -(uStack_74._1_1_ == cStack_63);
      auVar23[6] = -(uStack_74._2_1_ == cStack_62);
      auVar23[7] = -(uStack_74._3_1_ == cStack_61);
      auVar23[8] = -((ctrl_t)uStack_70 == cStack_60);
      auVar23[9] = -(uStack_70._1_1_ == cStack_5f);
      auVar23[10] = -(uStack_70._2_1_ == cStack_5e);
      auVar23[0xb] = -(uStack_70._3_1_ == cStack_5d);
      auVar23[0xc] = -((ctrl_t)uStack_6c == cStack_5c);
      auVar23[0xd] = -(uStack_6c._1_1_ == cStack_5b);
      auVar23[0xe] = -(uStack_6c._2_1_ == cStack_5a);
      auVar23[0xf] = -(uStack_6c._3_1_ == cStack_59);
      uVar6 = (ushort)(SUB161(auVar23 >> 7,0) & 1) | (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe | (ushort)(auVar23[0xf] >> 7) << 0xf;
      uVar22 = (uint)uVar6;
      local_88 = uVar19;
      while (uVar6 != 0) {
        uVar20 = 0;
        if (uVar22 != 0) {
          for (; (uVar22 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
          }
        }
        psVar8 = absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                 ::slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                               *)this_00.slot_);
        uVar19 = uVar20 + local_b8 & uVar17;
        bVar5 = anon_unknown_24::SymbolByParentEq::operator()
                          ((SymbolByParentEq *)(psVar8 + uVar19),(Symbol *)&local_a0,query);
        auVar3._8_8_ = 0;
        auVar3._0_8_ = aVar21;
        iVar25 = (iterator)(auVar3 << 0x40);
        if (bVar5) {
          iVar25 = absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                   ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                  *)this_00.slot_,uVar19);
          puVar13 = iVar25.ctrl_;
        }
        aVar21 = iVar25.field_1;
        if (bVar5) break;
        uVar6 = (ushort)(uVar22 - 1) & (ushort)uVar22;
        uVar22 = CONCAT22((short)(uVar22 - 1 >> 0x10),uVar6);
      }
      if (uVar6 != 0) {
LAB_00152577:
        bVar5 = false;
        uVar19 = local_88;
      }
      else {
        auVar24[0] = -(local_68 == kEmpty);
        auVar24[1] = -(cStack_67 == kEmpty);
        auVar24[2] = -(cStack_66 == kEmpty);
        auVar24[3] = -(cStack_65 == kEmpty);
        auVar24[4] = -(cStack_64 == kEmpty);
        auVar24[5] = -(cStack_63 == kEmpty);
        auVar24[6] = -(cStack_62 == kEmpty);
        auVar24[7] = -(cStack_61 == kEmpty);
        auVar24[8] = -(cStack_60 == kEmpty);
        auVar24[9] = -(cStack_5f == kEmpty);
        auVar24[10] = -(cStack_5e == kEmpty);
        auVar24[0xb] = -(cStack_5d == kEmpty);
        auVar24[0xc] = -(cStack_5c == kEmpty);
        auVar24[0xd] = -(cStack_5b == kEmpty);
        auVar24[0xe] = -(cStack_5a == kEmpty);
        auVar24[0xf] = -(cStack_59 == kEmpty);
        if ((((((((((((((((auVar24 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar24 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar24 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar24 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar24 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar24 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar24 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar24 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar24 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar24 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar24 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar24 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar24 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar24 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar24 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            cStack_59 == kEmpty) {
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
          ::AssertNotDebugCapacity
                    ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                      *)this_00.slot_);
          puVar13 = (undefined1 *)0x0;
          goto LAB_00152577;
        }
        uVar14 = (((CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                    *)&(this_00.slot_)->ptr_)->
                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 ).super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                 value.capacity_;
        if (uVar14 == 0) goto LAB_001528dc;
        uVar19 = local_88 + 0x10;
        if (uVar14 < uVar19) {
          __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0xe37,
                        "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>, K = google::protobuf::(anonymous namespace)::ParentNameFieldQuery]"
                       );
        }
        local_b8 = local_88 + local_b8 + 0x10 & uVar17;
        bVar5 = true;
      }
    } while (bVar5);
  }
LAB_001526f7:
  local_40 = (anon_union_8_1_a8a14541_for_iterator_2)puVar13;
  local_38 = aVar21;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
              *)this_00.slot_);
  local_50.inner_.ctrl_ = (ctrl_t *)0x0;
  bVar5 = absl::lts_20250127::container_internal::operator==((const_iterator *)&local_40,&local_50);
  if (bVar5) {
    return (FieldDescriptor *)0x0;
  }
  local_a0 = (anon_union_8_1_a8a14541_for_iterator_2)puVar13;
  local_98 = aVar21;
  if ((FileDescriptorTables *)puVar13 == (FileDescriptorTables *)0x0) {
    FindFieldByName();
  }
  else if ((FileDescriptorTables *)puVar13 !=
           (FileDescriptorTables *)(absl::lts_20250127::container_internal::kEmptyGroup + 0x10)) {
    if (-1 < (char)((HeapOrSoo *)&((slot_type *)puVar13)->ptr_)->soo_data[0]) {
      pSVar11 = absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                ::iterator::operator*((iterator *)&local_a0);
      if ((((FieldDescriptor *)pSVar11->ptr_)->super_SymbolBase).symbol_type_ == '\x02') {
        return (FieldDescriptor *)pSVar11->ptr_;
      }
      __assert_fail("field != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                    ,0x4c3,
                    "static SymbolT google::protobuf::(anonymous namespace)::ParentNameFieldQuery::IterToSymbol(It) [It = absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::const_iterator]"
                   );
    }
    goto LAB_001528b8;
  }
  FindFieldByName();
LAB_001528b8:
  FindFieldByName();
LAB_001528bd:
  __assert_fail("(IsFull(ctrl[i]) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0x79d,
                "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = google::protobuf::Symbol, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
               );
}

Assistant:

const FieldDescriptor* Descriptor::FindFieldByName(
    absl::string_view name) const {
  return file()->tables_->FindNestedSymbol<ParentNameFieldQuery>(this, name);
}